

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O1

size_t woff2::FontFileSize(Font *font)

{
  uint uVar1;
  ulong uVar2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  
  p_Var3 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar2 = (ulong)font->num_tables << 4 | 0xc;
  while ((_Rb_tree_header *)p_Var3 != &(font->tables)._M_t._M_impl.super__Rb_tree_header) {
    uVar1 = *(uint *)((long)&p_Var3[1]._M_left + 4);
    uVar4 = (ulong)*(uint *)&p_Var3[1]._M_left + (ulong)uVar1 + (ulong)(-uVar1 & 3);
    if (uVar4 < uVar2) {
      uVar4 = uVar2;
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    uVar2 = uVar4;
  }
  return uVar2;
}

Assistant:

size_t FontFileSize(const Font& font) {
  size_t max_offset = 12ULL + 16ULL * font.num_tables;
  for (const auto& i : font.tables) {
    const Font::Table& table = i.second;
    size_t padding_size = (4 - (table.length & 3)) & 3;
    size_t end_offset = (padding_size + table.offset) + table.length;
    max_offset = std::max(max_offset, end_offset);
  }
  return max_offset;
}